

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeRange.cpp
# Opt level: O2

void __thiscall
FIX::TimeRange::TimeRange
          (TimeRange *this,LocalTimeOnly *startTime,LocalTimeOnly *endTime,int startDay,int endDay)

{
  int64_t iVar1;
  undefined4 uVar2;
  bool bVar3;
  
  (this->m_startTime).super_DateTime._vptr_DateTime = (_func_int **)&PTR__DateTime_001fc7c0;
  uVar2 = *(undefined4 *)&(startTime->super_DateTime).field_0xc;
  iVar1 = (startTime->super_DateTime).m_time;
  (this->m_startTime).super_DateTime.m_date = (startTime->super_DateTime).m_date;
  *(undefined4 *)&(this->m_startTime).super_DateTime.field_0xc = uVar2;
  (this->m_startTime).super_DateTime.m_time = iVar1;
  (this->m_startTime).super_DateTime._vptr_DateTime = (_func_int **)&PTR__DateTime_001fcaa8;
  (this->m_startTime).super_DateTime.m_date = 0;
  (this->m_endTime).super_DateTime._vptr_DateTime = (_func_int **)&PTR__DateTime_001fc7c0;
  uVar2 = *(undefined4 *)&(endTime->super_DateTime).field_0xc;
  iVar1 = (endTime->super_DateTime).m_time;
  (this->m_endTime).super_DateTime.m_date = (endTime->super_DateTime).m_date;
  *(undefined4 *)&(this->m_endTime).super_DateTime.field_0xc = uVar2;
  (this->m_endTime).super_DateTime.m_time = iVar1;
  (this->m_endTime).super_DateTime._vptr_DateTime = (_func_int **)&PTR__DateTime_001fcaa8;
  (this->m_endTime).super_DateTime.m_date = 0;
  this->m_startDay = startDay;
  this->m_endDay = endDay;
  this->m_useLocalTime = true;
  if (((startDay == endDay) && (0 < startDay)) && (0 < endDay)) {
    bVar3 = operator>(&endTime->super_DateTime,&startTime->super_DateTime);
    if (bVar3) {
      uVar2 = *(undefined4 *)&(this->m_startTime).super_DateTime.field_0xc;
      iVar1 = (this->m_startTime).super_DateTime.m_time;
      (this->m_endTime).super_DateTime.m_date = (this->m_startTime).super_DateTime.m_date;
      *(undefined4 *)&(this->m_endTime).super_DateTime.field_0xc = uVar2;
      (this->m_endTime).super_DateTime.m_time = iVar1;
    }
  }
  return;
}

Assistant:

TimeRange::TimeRange(const LocalTimeOnly &startTime, const LocalTimeOnly &endTime, int startDay, int endDay)
    : m_startTime(startTime),
      m_endTime(endTime),
      m_startDay(startDay),
      m_endDay(endDay),
      m_useLocalTime(true) {
  if (startDay > 0 && endDay > 0 && startDay == endDay && endTime > startTime) {
    m_endTime = m_startTime;
  }
}